

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autolink.cc
# Opt level: O1

base_learner * autolink_setup(options_i *options,vw *all)

{
  int iVar1;
  autolink *dat;
  base_learner *l;
  single_learner *base;
  learner<autolink,_example> *plVar2;
  uint32_t *puVar3;
  size_type __dnew;
  option_group_definition new_options;
  long local_170;
  option_group_definition local_168;
  long *local_130;
  long local_128;
  long local_120 [2];
  string local_110;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  dat = calloc_or_throw<autolink>(1);
  dat->d = 0;
  dat->stride_shift = 0;
  local_e0 = 0x6b6e696c6f747541;
  local_e8 = 8;
  local_d8 = 0;
  local_168.m_name._M_dataplus._M_p = (pointer)&local_168.m_name.field_2;
  local_f0 = &local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_168,&local_e0);
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  local_110.field_2._M_allocated_capacity = 0x6b6e696c6f747561;
  local_110._M_string_length = 8;
  local_110.field_2._M_local_buf[8] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_d0,&local_110,&dat->d);
  local_60 = true;
  local_170 = 0x26;
  local_130 = local_120;
  local_130 = (long *)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_170);
  local_120[0] = local_170;
  local_130[2] = 0x746977206e6f6974;
  local_130[3] = 0x6f6e796c6f702068;
  *local_130 = 0x6c20657461657263;
  local_130[1] = 0x636e7566206b6e69;
  builtin_strncpy((char *)((long)local_130 + 0x1e),"nomial d",8);
  local_128 = local_170;
  *(char *)((long)local_130 + local_170) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_168,(typed_option<unsigned_int> *)local_d0);
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  local_d0._0_8_ = &PTR__typed_option_002d8648;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_168);
  local_d0._16_8_ = 0x6b6e696c6f747561;
  local_d0._8_8_ = (pointer)0x8;
  local_d0[0x18] = '\0';
  local_d0._0_8_ = local_d0 + 0x10;
  iVar1 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<autolink,_example> *)0x0;
  }
  else {
    puVar3 = &(all->weights).dense_weights._stride_shift;
    if ((all->weights).sparse != false) {
      puVar3 = &(all->weights).sparse_weights._stride_shift;
    }
    dat->stride_shift = *puVar3;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<autolink,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,1,
                        *(prediction_type_t *)(base + 0xd0));
    dat = (autolink *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_168.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_name._M_dataplus._M_p != &local_168.m_name.field_2) {
    operator_delete(local_168.m_name._M_dataplus._M_p);
  }
  if (dat != (autolink *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* autolink_setup(options_i& options, vw& all)
{
  free_ptr<autolink> data = scoped_calloc_or_throw<autolink>();
  option_group_definition new_options("Autolink");
  new_options.add(make_option("autolink", data->d).keep().help("create link function with polynomial d"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("autolink"))
    return nullptr;

  data->stride_shift = all.weights.stride_shift();

  LEARNER::learner<autolink, example>& ret =
      init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);

  return make_base(ret);
}